

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O3

events_output_state __thiscall E64::host_t::events_process_events(host_t *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  events_output_state eVar5;
  char *format;
  host_t *this_00;
  SDL_Event event;
  SDL_AudioDeviceID local_68;
  Uint32 local_54;
  
  this_00 = (host_t *)&stack0xffffffffffffff98;
  uVar1 = this->sdl_keyboard_state[0xe6];
  uVar2 = this->sdl_keyboard_state[0xe2];
  iVar4 = SDL_PollEvent();
  if (iVar4 == 0) {
    eVar5 = NO_EVENT;
  }
  else {
    eVar5 = NO_EVENT;
    do {
      if (local_68 == 0x100) {
LAB_00111592:
        eVar5 = QUIT_EVENT;
      }
      else if (local_68 == 0x300) {
        if ((local_54 == 0x66) && (uVar1 != '\0' || uVar2 != '\0')) {
          events_wait_until_key_released(this_00,SDLK_f);
          video_toggle_fullscreen(this);
        }
        else if ((local_54 == 0x73) && (uVar1 != '\0' || uVar2 != '\0')) {
          video_change_scanlines_intensity(this);
        }
        else if ((local_54 == 0x62) && (uVar1 != '\0' || uVar2 != '\0')) {
          video_toggle_linear_filtering(this);
        }
        else if ((local_54 == 0x72) && (uVar1 != '\0' || uVar2 != '\0')) {
          events_wait_until_key_released(this_00,SDLK_r);
          hud_t::show_notification(this->hud,"\nResetting system");
        }
        else {
          if ((local_54 == 0x71) && (uVar1 != '\0' || uVar2 != '\0')) {
            events_wait_until_key_released(this_00,SDLK_q);
            goto LAB_00111592;
          }
          if ((local_54 == 0x2d) && (uVar1 != '\0' || uVar2 != '\0')) {
            events_wait_until_key_released(this_00,SDLK_MINUS);
            video_decrease_window_size(this);
          }
          else {
            if ((local_54 != 0x3d) || (uVar1 == '\0' && uVar2 == '\0')) {
              eVar5 = KEYPRESS_EVENT;
              if (local_54 == 0x77) {
                if (uVar1 != '\0' || uVar2 != '\0') {
                  format = "\nStop recording sound";
                  if (this->settings->audio_recording == false) {
                    format = "\nStart recording sound";
                  }
                  hud_t::show_notification(this->hud,format);
                  settings_t::audio_toggle_recording(this->settings);
                }
              }
              else if (local_54 == 0x40000043) {
                this->hud->stats_visible = (bool)(this->hud->stats_visible ^ 1);
              }
              goto LAB_00111597;
            }
            events_wait_until_key_released(this_00,SDLK_EQUALS);
            video_increase_window_size(this);
          }
        }
        eVar5 = KEYPRESS_EVENT;
      }
LAB_00111597:
      this_00 = (host_t *)&stack0xffffffffffffff98;
      iVar4 = SDL_PollEvent();
    } while (iVar4 != 0);
  }
  if (uVar1 == '\0' && uVar2 == '\0') {
    puVar3 = this->sdl_keyboard_state;
    this->keyboard_state[1] = this->keyboard_state[1] * '\x02' | puVar3[0x29] != '\0';
    this->keyboard_state[2] = this->keyboard_state[2] * '\x02' | puVar3[0x3a] != '\0';
    this->keyboard_state[3] = this->keyboard_state[3] * '\x02' | puVar3[0x3b] != '\0';
    this->keyboard_state[4] = this->keyboard_state[4] * '\x02' | puVar3[0x3c] != '\0';
    this->keyboard_state[5] = this->keyboard_state[5] * '\x02' | puVar3[0x3d] != '\0';
    this->keyboard_state[6] = this->keyboard_state[6] * '\x02' | puVar3[0x3e] != '\0';
    this->keyboard_state[7] = this->keyboard_state[7] * '\x02' | puVar3[0x3f] != '\0';
    this->keyboard_state[8] = this->keyboard_state[8] * '\x02' | puVar3[0x40] != '\0';
    this->keyboard_state[9] = this->keyboard_state[9] * '\x02' | puVar3[0x41] != '\0';
    this->keyboard_state[10] = this->keyboard_state[10] * '\x02' | puVar3[0x35] != '\0';
    this->keyboard_state[0xb] = this->keyboard_state[0xb] * '\x02' | puVar3[0x1e] != '\0';
    this->keyboard_state[0xc] = this->keyboard_state[0xc] * '\x02' | puVar3[0x1f] != '\0';
    this->keyboard_state[0xd] = this->keyboard_state[0xd] * '\x02' | puVar3[0x20] != '\0';
    this->keyboard_state[0xe] = this->keyboard_state[0xe] * '\x02' | puVar3[0x21] != '\0';
    this->keyboard_state[0xf] = this->keyboard_state[0xf] * '\x02' | puVar3[0x22] != '\0';
    this->keyboard_state[0x10] = this->keyboard_state[0x10] * '\x02' | puVar3[0x23] != '\0';
    this->keyboard_state[0x11] = this->keyboard_state[0x11] * '\x02' | puVar3[0x24] != '\0';
    this->keyboard_state[0x12] = this->keyboard_state[0x12] * '\x02' | puVar3[0x25] != '\0';
    this->keyboard_state[0x13] = this->keyboard_state[0x13] * '\x02' | puVar3[0x26] != '\0';
    this->keyboard_state[0x14] = this->keyboard_state[0x14] * '\x02' | puVar3[0x27] != '\0';
    this->keyboard_state[0x15] = this->keyboard_state[0x15] * '\x02' | puVar3[0x2d] != '\0';
    this->keyboard_state[0x16] = this->keyboard_state[0x16] * '\x02' | puVar3[0x2e] != '\0';
    this->keyboard_state[0x17] = this->keyboard_state[0x17] * '\x02' | puVar3[0x2a] != '\0';
    this->keyboard_state[0x18] = this->keyboard_state[0x18] * '\x02' | puVar3[0x2b] != '\0';
    this->keyboard_state[0x19] = this->keyboard_state[0x19] * '\x02' | puVar3[0x14] != '\0';
    this->keyboard_state[0x1a] = this->keyboard_state[0x1a] * '\x02' | puVar3[0x1a] != '\0';
    this->keyboard_state[0x1b] = this->keyboard_state[0x1b] * '\x02' | puVar3[8] != '\0';
    this->keyboard_state[0x1c] = this->keyboard_state[0x1c] * '\x02' | puVar3[0x15] != '\0';
    this->keyboard_state[0x1d] = this->keyboard_state[0x1d] * '\x02' | puVar3[0x17] != '\0';
    this->keyboard_state[0x1e] = this->keyboard_state[0x1e] * '\x02' | puVar3[0x1c] != '\0';
    this->keyboard_state[0x1f] = this->keyboard_state[0x1f] * '\x02' | puVar3[0x18] != '\0';
    this->keyboard_state[0x20] = this->keyboard_state[0x20] * '\x02' | puVar3[0xc] != '\0';
    this->keyboard_state[0x21] = this->keyboard_state[0x21] * '\x02' | puVar3[0x12] != '\0';
    this->keyboard_state[0x22] = this->keyboard_state[0x22] * '\x02' | puVar3[0x13] != '\0';
    this->keyboard_state[0x23] = this->keyboard_state[0x23] * '\x02' | puVar3[0x2f] != '\0';
    this->keyboard_state[0x24] = this->keyboard_state[0x24] * '\x02' | puVar3[0x30] != '\0';
    this->keyboard_state[0x25] = this->keyboard_state[0x25] * '\x02' | puVar3[0x28] != '\0';
    this->keyboard_state[0x26] = this->keyboard_state[0x26] * '\x02' | puVar3[4] != '\0';
    this->keyboard_state[0x27] = this->keyboard_state[0x27] * '\x02' | puVar3[0x16] != '\0';
    this->keyboard_state[0x28] = this->keyboard_state[0x28] * '\x02' | puVar3[7] != '\0';
    this->keyboard_state[0x29] = this->keyboard_state[0x29] * '\x02' | puVar3[9] != '\0';
    this->keyboard_state[0x2a] = this->keyboard_state[0x2a] * '\x02' | puVar3[10] != '\0';
    this->keyboard_state[0x2b] = this->keyboard_state[0x2b] * '\x02' | puVar3[0xb] != '\0';
    this->keyboard_state[0x2c] = this->keyboard_state[0x2c] * '\x02' | puVar3[0xd] != '\0';
    this->keyboard_state[0x2d] = this->keyboard_state[0x2d] * '\x02' | puVar3[0xe] != '\0';
    this->keyboard_state[0x2e] = this->keyboard_state[0x2e] * '\x02' | puVar3[0xf] != '\0';
    this->keyboard_state[0x2f] = this->keyboard_state[0x2f] * '\x02' | puVar3[0x33] != '\0';
    this->keyboard_state[0x30] = this->keyboard_state[0x30] * '\x02' | puVar3[0x34] != '\0';
    this->keyboard_state[0x31] = this->keyboard_state[0x31] * '\x02' | puVar3[0x31] != '\0';
    this->keyboard_state[0x32] = this->keyboard_state[0x32] * '\x02' | puVar3[0xe1] != '\0';
    this->keyboard_state[0x33] = this->keyboard_state[0x33] * '\x02' | puVar3[0x1d] != '\0';
    this->keyboard_state[0x34] = this->keyboard_state[0x34] * '\x02' | puVar3[0x1b] != '\0';
    this->keyboard_state[0x35] = this->keyboard_state[0x35] * '\x02' | puVar3[6] != '\0';
    this->keyboard_state[0x36] = this->keyboard_state[0x36] * '\x02' | puVar3[0x19] != '\0';
    this->keyboard_state[0x37] = this->keyboard_state[0x37] * '\x02' | puVar3[5] != '\0';
    this->keyboard_state[0x38] = this->keyboard_state[0x38] * '\x02' | puVar3[0x11] != '\0';
    this->keyboard_state[0x39] = this->keyboard_state[0x39] * '\x02' | puVar3[0x10] != '\0';
    this->keyboard_state[0x3a] = this->keyboard_state[0x3a] * '\x02' | puVar3[0x36] != '\0';
    this->keyboard_state[0x3b] = this->keyboard_state[0x3b] * '\x02' | puVar3[0x37] != '\0';
    this->keyboard_state[0x3c] = this->keyboard_state[0x3c] * '\x02' | puVar3[0x38] != '\0';
    this->keyboard_state[0x3d] = this->keyboard_state[0x3d] * '\x02' | puVar3[0xe5] != '\0';
    this->keyboard_state[0x3e] = this->keyboard_state[0x3e] * '\x02' | puVar3[0xe0] != '\0';
    this->keyboard_state[0x3f] = this->keyboard_state[0x3f] * '\x02' | puVar3[0x2c] != '\0';
    this->keyboard_state[0x40] = this->keyboard_state[0x40] * '\x02' | puVar3[0xe4] != '\0';
    this->keyboard_state[0x41] = this->keyboard_state[0x41] * '\x02' | puVar3[0x50] != '\0';
    this->keyboard_state[0x42] = this->keyboard_state[0x42] * '\x02' | puVar3[0x52] != '\0';
    this->keyboard_state[0x43] = this->keyboard_state[0x43] * '\x02' | puVar3[0x51] != '\0';
    this->keyboard_state[0x44] = this->keyboard_state[0x44] * '\x02' | puVar3[0x4f] != '\0';
  }
  if (eVar5 == QUIT_EVENT) {
    puts("[SDL] detected quit event");
  }
  return eVar5;
}

Assistant:

enum E64::events_output_state E64::host_t::events_process_events()
{
	enum events_output_state return_value = NO_EVENT;
	
	SDL_Event event;
	
	//bool shift_pressed = E64_sdl2_keyboard_state[SDL_SCANCODE_LSHIFT] | E64_sdl2_keyboard_state[SDL_SCANCODE_RSHIFT];
	bool alt_pressed = sdl_keyboard_state[SDL_SCANCODE_LALT] | sdl_keyboard_state[SDL_SCANCODE_RALT];
	//bool gui_pressed   = E64_sdl2_keyboard_state[SDL_SCANCODE_LGUI] | E64_sdl2_keyboard_state[SDL_SCANCODE_RGUI];
	
	while (SDL_PollEvent(&event)) {
		switch(event.type) {
			case SDL_KEYDOWN:
				return_value = KEYPRESS_EVENT;
				if( (event.key.keysym.sym == SDLK_f) && alt_pressed ) {
					events_wait_until_key_released(SDLK_f);
					video_toggle_fullscreen();
				} else if( (event.key.keysym.sym == SDLK_s) && alt_pressed ) {
					video_change_scanlines_intensity();
				} else if ((event.key.keysym.sym == SDLK_b) && alt_pressed) {
					video_toggle_linear_filtering();
				} else if ((event.key.keysym.sym == SDLK_r) && alt_pressed) {
					events_wait_until_key_released(SDLK_r);
					hud->show_notification("\nResetting system");
				} else if( (event.key.keysym.sym == SDLK_q) && alt_pressed ) {
					events_wait_until_key_released(SDLK_q);
					return_value = QUIT_EVENT;
				} else if ((event.key.keysym.sym == SDLK_MINUS) && alt_pressed) {
					// decrease screen size
					events_wait_until_key_released(SDLK_MINUS);
					video_decrease_window_size();
				} else if ((event.key.keysym.sym == SDLK_EQUALS) && alt_pressed) {
					// decrease screen size
					events_wait_until_key_released(SDLK_EQUALS);
					video_increase_window_size();
				} else if(event.key.keysym.sym == SDLK_F10) {
					hud->toggle_stats();
				} else if((event.key.keysym.sym == SDLK_w) && alt_pressed) {
					// TODO: does this always work?
					if (settings->audio_recording) {
						hud->show_notification("\nStop recording sound");
					} else {
						hud->show_notification("\nStart recording sound");
					}
					settings->audio_toggle_recording();
				}
				break;
			case SDL_QUIT:
				return_value = QUIT_EVENT;
				break;
		}
	}

	if (!alt_pressed) {
		(keyboard_state[SCANCODE_ESCAPE      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_ESCAPE      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F1          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F1          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F2          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F2          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F3          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F3          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F4          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F4          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F5          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F5          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F6          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F6          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F7          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F7          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F8          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F8          ] ? 0b1 : 0b0;
		// TODO: what was different here in old E64?
		(keyboard_state[SCANCODE_GRAVE       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_GRAVE       ] ? 0b1 : 0b0;
		//
		(keyboard_state[SCANCODE_1           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_1           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_2           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_2           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_3           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_3           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_4           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_4           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_5           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_5           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_6           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_6           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_7           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_7           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_8           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_8           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_9           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_9           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_0           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_0           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_MINUS       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_MINUS       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_EQUALS      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_EQUALS      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_BACKSPACE   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_BACKSPACE   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_TAB         ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_TAB         ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Q           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Q           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_W           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_W           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_E           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_E           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_R           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_R           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_T           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_T           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Y           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Y           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_U           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_U           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_I           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_I           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_O           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_O           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_P           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_P           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LEFTBRACKET ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LEFTBRACKET ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RIGHTBRACKET] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RIGHTBRACKET] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RETURN      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RETURN      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_A           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_A           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_S           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_S           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_D           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_D           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_F           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_F           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_G           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_G           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_H           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_H           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_J           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_J           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_K           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_K           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_L           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_L           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SEMICOLON   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SEMICOLON   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_APOSTROPHE  ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_APOSTROPHE  ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_BACKSLASH   ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_BACKSLASH   ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LSHIFT      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LSHIFT      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_Z           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_Z           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_X           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_X           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_C           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_C           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_V           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_V           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_B           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_B           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_N           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_N           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_M           ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_M           ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_COMMA       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_COMMA       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_PERIOD      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_PERIOD      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SLASH       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SLASH       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RSHIFT      ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RSHIFT      ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LCTRL       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LCTRL       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_SPACE       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_SPACE       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RCTRL       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RCTRL       ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_LEFT        ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_LEFT        ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_UP          ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_UP          ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_DOWN        ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_DOWN        ] ? 0b1 : 0b0;
		(keyboard_state[SCANCODE_RIGHT       ] <<= 1) |= sdl_keyboard_state[SDL_SCANCODE_RIGHT       ] ? 0b1 : 0b0;
	};
	
	if (return_value == QUIT_EVENT) printf("[SDL] detected quit event\n");
	return return_value;
}